

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_race(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  RACE_DATA *pRVar4;
  char *txt;
  ulong uVar5;
  long lVar6;
  char buf [4608];
  char acStack_1238 [4616];
  
  if ((*argument != '\0') && (iVar3 = race_lookup(argument), iVar3 != -1)) {
    pvVar1 = ch->desc->pEdit;
    *(short *)((long)pvVar1 + 0x11c) = (short)iVar3;
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0xc0),pRVar4->off);
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0xd0),pRVar4->imm);
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0xe0),pRVar4->res);
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0xf0),pRVar4->vuln);
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0x128),pRVar4->form);
    pRVar4 = race_data_lookup(iVar3);
    BITWISE_OR((long *)((long)pvVar1 + 0x138),pRVar4->parts);
    send_to_char("Race set.\n\r",ch);
    return true;
  }
  if (*argument == '?') {
    send_to_char("Available races are:",ch);
    if ((race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
         super__Vector_impl_data._M_start)->name != (char *)0x0) {
      uVar5 = 0;
      iVar3 = 0;
      lVar6 = 0;
      do {
        if ((int)(uVar5 / 3) * 3 + iVar3 == 0) {
          send_to_char("\n\r",ch);
        }
        sprintf(acStack_1238," %-15s",
                *(undefined8 *)
                 ((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                         _M_impl.super__Vector_impl_data._M_start)->act + lVar6 + -0x10));
        send_to_char(acStack_1238,ch);
        iVar3 = iVar3 + -1;
        uVar5 = (ulong)((int)uVar5 + 1);
        lVar2 = lVar6 + -0x10;
        lVar6 = lVar6 + 0x2e8;
      } while (*(long *)((long)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].act + lVar2) != 0);
    }
    txt = "\n\r";
  }
  else {
    txt = "Syntax:  race [race]\n\rType \'race ?\' for a list of races.\n\r";
  }
  send_to_char(txt,ch);
  return false;
}

Assistant:

bool medit_race(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int race;

	if (argument[0] != '\0' && (race = race_lookup(argument)) != -1)
	{
		EDIT_MOB(ch, pMob);

		pMob->race = race;
		BITWISE_OR(pMob->off_flags, race_data_lookup(race)->off);
		BITWISE_OR(pMob->imm_flags, race_data_lookup(race)->imm);
		BITWISE_OR(pMob->res_flags, race_data_lookup(race)->res);
		BITWISE_OR(pMob->vuln_flags, race_data_lookup(race)->vuln);
		BITWISE_OR(pMob->form, race_data_lookup(race)->form);
		BITWISE_OR(pMob->parts, race_data_lookup(race)->parts);

		send_to_char("Race set.\n\r", ch);
		return true;
	}

	if (argument[0] == '?')
	{
		char buf[MAX_STRING_LENGTH];

		send_to_char("Available races are:", ch);

		for (race = 0; race_table[race].name != nullptr; race++)
		{
			if (race % 3 == 0)
				send_to_char("\n\r", ch);

			sprintf(buf, " %-15s", race_table[race].name);
			send_to_char(buf, ch);
		}

		send_to_char("\n\r", ch);
		return false;
	}

	send_to_char("Syntax:  race [race]\n\r"\
				 "Type 'race ?' for a list of races.\n\r", ch);
	return false;
}